

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall Fossilize::FeatureFilter::Impl::pnext_chain_is_supported(Impl *this,void *pNext)

{
  VkStructureType VVar1;
  int iVar2;
  bool bVar3;
  uint *puVar4;
  size_type sVar5;
  VkBool32 local_690;
  bool local_68b;
  allocator local_669;
  string local_668 [32];
  VkBaseInStructure *local_648;
  VkDepthBiasRepresentationInfoEXT *info_7;
  string local_638 [32];
  undefined8 local_618;
  VkPhysicalDeviceRobustness2FeaturesEXT robust2_1;
  VkPhysicalDeviceFeatures2 pdf2_2;
  VkPhysicalDeviceRobustness2FeaturesEXT robust2;
  VkPhysicalDeviceFeatures2 pdf2_1;
  VkPhysicalDeviceImageRobustnessFeaturesEXT robust_image;
  VkPhysicalDeviceFeatures2 pdf2;
  bool need_robust_buffer2;
  bool need_robust_image2;
  bool need_robust_image;
  VkPipelineRobustnessCreateInfoEXT *info_6;
  string local_2d8 [32];
  VkBaseInStructure *local_2b8;
  VkPipelineSampleLocationsStateCreateInfoEXT *info_5;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [36];
  VkStructureType local_25c;
  VkBaseInStructure *pVStack_258;
  uint32_t i_6;
  VkRenderPassInputAttachmentAspectCreateInfo *info_4;
  string local_248 [32];
  VkBaseInStructure *local_228;
  VkSamplerReductionModeCreateInfo *info_3;
  string local_218 [32];
  VkBaseInStructure *local_1f8;
  VkSamplerCustomBorderColorCreateInfoEXT *info_2;
  string local_1e8 [32];
  VkBaseInStructure *local_1c8;
  VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *info_1;
  string local_1b8 [36];
  uint local_194;
  VkBaseInStructure *pVStack_190;
  uint32_t i_5;
  VkPipelineRenderingCreateInfoKHR *info;
  uint local_180;
  uint32_t aspect;
  uint32_t lower;
  uint32_t higher;
  uint32_t height;
  uint32_t width;
  VkFragmentShadingRateAttachmentInfoKHR *attachment;
  VkBool32 cond;
  bool use_zero;
  VkSubpassDescriptionDepthStencilResolve *resolve;
  string local_150 [32];
  VkBaseInStructure *local_130;
  VkAttachmentReferenceStencilLayout *layout_1;
  VkAttachmentDescriptionStencilLayout *layout;
  uint32_t j;
  uint32_t i_4;
  VkMutableDescriptorTypeCreateInfoEXT *lists;
  VkPipelineRasterizationLineStateCreateInfoKHR *line;
  string local_100 [32];
  VkStructureType local_e0;
  VkStructureType local_dc;
  uint32_t i_3;
  VkDescriptorBindingFlagsEXT flag_union;
  VkDescriptorSetLayoutBindingFlagsCreateInfo *flags;
  uint32_t i_2;
  uint32_t i_1;
  VkRenderPassMultiviewCreateInfo *multiview;
  VkPipelineRasterizationDepthClipStateCreateInfoEXT *clip;
  uint local_b0;
  uint32_t i;
  uint32_t max_divisor;
  bool use_non_identity_divisor;
  bool use_zero_divisor;
  VkPipelineVertexInputDivisorStateCreateInfoEXT *divisor;
  string local_98 [39];
  allocator local_71;
  string local_70 [39];
  allocator local_49;
  string local_48 [32];
  VkBaseInStructure *local_28;
  VkBaseInStructure *base;
  void *pNext_local;
  Impl *this_local;
  
  base = (VkBaseInStructure *)pNext;
  pNext_local = this;
  do {
    if (base == (VkBaseInStructure *)0x0) {
      return true;
    }
    local_28 = base;
    VVar1 = base->sType;
    if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT) {
      if ((this->features).transform_feedback.geometryStreams == 0) {
        return false;
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO) {
      if ((this->features).dynamic_rendering.dynamicRendering == 0) {
        return false;
      }
      pVStack_190 = base;
      for (local_194 = 0; local_194 < *(uint *)&pVStack_190[1].field_0x4; local_194 = local_194 + 1)
      {
        if (((&(pVStack_190[1].pNext)->sType)[local_194] != VK_STRUCTURE_TYPE_APPLICATION_INFO) &&
           (bVar3 = format_is_supported(this,(&(pVStack_190[1].pNext)->sType)[local_194],0x80),
           !bVar3)) {
          return false;
        }
      }
      if ((pVStack_190[2].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) &&
         (bVar3 = format_is_supported(this,pVStack_190[2].sType,0x200), !bVar3)) {
        return false;
      }
      if ((*(int *)&pVStack_190[2].field_0x4 != 0) &&
         (bVar3 = format_is_supported(this,*(VkFormat *)&pVStack_190[2].field_0x4,0x200), !bVar3)) {
        return false;
      }
      if (((pVStack_190[2].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) &&
          (*(int *)&pVStack_190[2].field_0x4 != 0)) &&
         (pVStack_190[2].sType != *(VkStructureType *)&pVStack_190[2].field_0x4)) {
        return false;
      }
      if ((pVStack_190[1].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) &&
         (bVar3 = multiview_mask_is_supported(this,pVStack_190[1].sType), !bVar3)) {
        return false;
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO) {
      if ((this->features).multiview.multiview == 0) {
        return false;
      }
      _i_2 = base;
      for (flags._4_4_ = VK_STRUCTURE_TYPE_APPLICATION_INFO; flags._4_4_ < _i_2[1].sType;
          flags._4_4_ = flags._4_4_ + VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO) {
        bVar3 = multiview_mask_is_supported(this,(&(_i_2[1].pNext)->sType)[flags._4_4_]);
        if (!bVar3) {
          return false;
        }
      }
      for (flags._0_4_ = VK_STRUCTURE_TYPE_APPLICATION_INFO; (VkStructureType)flags < _i_2[3].sType;
          flags._0_4_ = (VkStructureType)flags + VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO) {
        bVar3 = multiview_mask_is_supported(this,(&(_i_2[3].pNext)->sType)[(VkStructureType)flags]);
        if (!bVar3) {
          return false;
        }
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2d8,"VK_EXT_pipeline_robustness",(allocator *)((long)&info_6 + 7));
      sVar5 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->enabled_extensions,(key_type *)local_2d8);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&info_6 + 7));
      if (sVar5 == 0) {
        return false;
      }
      if ((((base[1].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) ||
           (*(int *)((long)&base[1].pNext + 4) != 0)) ||
          ((*(int *)&base[1].field_0x4 != 0 || (*(int *)&base[1].pNext != 0)))) &&
         ((this->features).pipeline_robustness.pipelineRobustness == 0)) {
        return false;
      }
      if (this->query == (DeviceQueryInterface *)0x0) {
        return false;
      }
      iVar2 = *(int *)((long)&base[1].pNext + 4);
      bVar3 = true;
      if ((base[1].sType != VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO) &&
         (bVar3 = true, *(int *)&base[1].pNext != 3)) {
        bVar3 = *(int *)&base[1].field_0x4 == 3;
      }
      if (*(int *)((long)&base[1].pNext + 4) == 2) {
        memset(&robust_image.robustImageAccess,0,0xf0);
        robust_image.robustImageAccess = 0x3b9bb078;
        robust_image.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        robust_image._4_4_ = 0;
        robust_image.pNext = (void *)0x0;
        (*this->query->_vptr_DeviceQueryInterface[4])();
        if ((int)robust_image.pNext == 0) {
          return false;
        }
      }
      if (iVar2 == 3) {
        memset(&robust2.nullDescriptor,0,0xf0);
        robust2.nullDescriptor = 0x3b9bb078;
        robust2.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        robust2._4_4_ = 0;
        robust2.pNext = (void *)0x0;
        robust2.robustBufferAccess2 = 0;
        robust2.robustImageAccess2 = 0;
        (*this->query->_vptr_DeviceQueryInterface[4])();
        if (robust2.pNext._4_4_ == 0) {
          return false;
        }
      }
      if (bVar3) {
        memset(&robust2_1.nullDescriptor,0,0xf0);
        robust2_1.nullDescriptor = 0x3b9bb078;
        local_618 = 0x3b9f2730;
        robust2_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        robust2_1._4_4_ = 0;
        robust2_1.pNext = (void *)0x0;
        robust2_1.robustBufferAccess2 = 0;
        robust2_1.robustImageAccess2 = 0;
        (*this->query->_vptr_DeviceQueryInterface[4])(this->query,&robust2_1.nullDescriptor);
        if ((int)robust2_1.pNext == 0) {
          return false;
        }
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,"VK_EXT_discard_rectangles",&local_281);
      sVar5 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->enabled_extensions,(key_type *)local_280);
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      if (sVar5 == 0) {
        return false;
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,"VK_EXT_conservative_rasterization",(allocator *)((long)&line + 7));
      sVar5 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->enabled_extensions,(key_type *)local_100);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)((long)&line + 7));
      if (sVar5 == 0) {
        return false;
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT) {
      multiview = (VkRenderPassMultiviewCreateInfo *)base;
      if ((*(int *)&base[1].field_0x4 != 0) && ((this->features).depth_clip.depthClipEnable == 0)) {
        return false;
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_248,"VK_KHR_maintenance2",(allocator *)((long)&info_4 + 7))
      ;
      sVar5 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->enabled_extensions,(key_type *)local_248);
      bVar3 = false;
      if (sVar5 == 0) {
        bVar3 = this->api_version < 0x401000;
      }
      std::__cxx11::string::~string(local_248);
      std::allocator<char>::~allocator((allocator<char> *)((long)&info_4 + 7));
      if (bVar3) {
        return false;
      }
      pVStack_258 = base;
      for (local_25c = VK_STRUCTURE_TYPE_APPLICATION_INFO; local_25c < pVStack_258[1].sType;
          local_25c = local_25c + VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO) {
        bVar3 = aspect_mask_is_supported
                          (this,*(VkImageAspectFlags *)
                                 ((long)&(pVStack_258[1].pNext)->pNext + (ulong)local_25c * 0xc));
        if (!bVar3) {
          return false;
        }
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,"VK_KHR_maintenance2",&local_49);
      sVar5 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->enabled_extensions,(key_type *)local_48);
      bVar3 = false;
      if (sVar5 == 0) {
        bVar3 = this->api_version < 0x401000;
      }
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      if (bVar3) {
        return false;
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_218,"VK_EXT_sampler_filter_minmax",(allocator *)((long)&info_3 + 7));
      sVar5 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->enabled_extensions,(key_type *)local_218);
      bVar3 = false;
      if (sVar5 == 0) {
        bVar3 = (this->features).vk12.samplerFilterMinmax == 0;
      }
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator((allocator<char> *)((long)&info_3 + 7));
      if (bVar3) {
        return false;
      }
      local_228 = base;
      if (VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO < base[1].sType) {
        return false;
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_668,"VK_EXT_sample_locations",&local_669);
      sVar5 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->enabled_extensions,(key_type *)local_668);
      std::__cxx11::string::~string(local_668);
      std::allocator<char>::~allocator((allocator<char> *)&local_669);
      if (sVar5 == 0) {
        return false;
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2a8,"VK_EXT_sample_locations",(allocator *)((long)&info_5 + 7));
      sVar5 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->enabled_extensions,(key_type *)local_2a8);
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&info_5 + 7));
      if (sVar5 == 0) {
        return false;
      }
      local_2b8 = base;
      if ((base[1].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) && (*(int *)&base[3].field_0x4 != 0)
         ) {
        if (((this->props).sample_locations.maxSampleLocationGridSize.width <
             *(uint *)((long)&base[2].pNext + 4)) ||
           ((this->props).sample_locations.maxSampleLocationGridSize.height < base[3].sType)) {
          return false;
        }
        if (((this->props).sample_locations.sampleLocationSampleCounts & *(uint *)&base[2].pNext) ==
            0) {
          return false;
        }
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT) {
      if ((this->features).blend_operation_advanced.advancedBlendCoherentOperations == 0) {
        return false;
      }
    }
    else if (VVar1 + 0xc462d4a0 < 2) {
      if ((this->features).ycbcr_conversion.samplerYcbcrConversion == 0) {
        return false;
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO) {
      _i_3 = base;
      local_dc = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      for (local_e0 = VK_STRUCTURE_TYPE_APPLICATION_INFO; local_e0 < base[1].sType;
          local_e0 = local_e0 + VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO) {
        local_dc = (&(base[1].pNext)->sType)[local_e0] | local_dc;
      }
      if (((local_dc & VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO) !=
           VK_STRUCTURE_TYPE_APPLICATION_INFO) &&
         ((this->features).descriptor_indexing.descriptorBindingUpdateUnusedWhilePending == 0)) {
        return false;
      }
      if (((local_dc & VK_STRUCTURE_TYPE_SUBMIT_INFO) != VK_STRUCTURE_TYPE_APPLICATION_INFO) &&
         ((this->features).descriptor_indexing.descriptorBindingPartiallyBound == 0)) {
        return false;
      }
      if (((local_dc & VK_STRUCTURE_TYPE_FENCE_CREATE_INFO) != VK_STRUCTURE_TYPE_APPLICATION_INFO)
         && ((this->features).descriptor_indexing.descriptorBindingVariableDescriptorCount == 0)) {
        return false;
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"VK_EXT_vertex_attribute_divisor",&local_71);
      sVar5 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->enabled_extensions,(key_type *)local_70);
      divisor._6_1_ = 0;
      divisor._5_1_ = 0;
      bVar3 = false;
      if (sVar5 == 0) {
        std::allocator<char>::allocator();
        divisor._6_1_ = 1;
        std::__cxx11::string::string
                  (local_98,"VK_KHR_vertex_attribute_divisor",(allocator *)((long)&divisor + 7));
        divisor._5_1_ = 1;
        sVar5 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&this->enabled_extensions,(key_type *)local_98);
        bVar3 = sVar5 == 0;
      }
      if ((divisor._5_1_ & 1) != 0) {
        std::__cxx11::string::~string(local_98);
      }
      if ((divisor._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&divisor + 7));
      }
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      if (bVar3) {
        return false;
      }
      _max_divisor = base;
      i._3_1_ = 0;
      i._2_1_ = 0;
      local_b0 = 0;
      for (clip._4_4_ = VK_STRUCTURE_TYPE_APPLICATION_INFO; clip._4_4_ < _max_divisor[1].sType;
          clip._4_4_ = clip._4_4_ + VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO) {
        if (*(int *)(&(_max_divisor[1].pNext)->field_0x4 + (ulong)clip._4_4_ * 8) != 1) {
          i._2_1_ = 1;
        }
        if (*(int *)(&(_max_divisor[1].pNext)->field_0x4 + (ulong)clip._4_4_ * 8) == 0) {
          i._3_1_ = 1;
        }
        puVar4 = std::max<unsigned_int>
                           (&local_b0,
                            (uint *)(&(_max_divisor[1].pNext)->field_0x4 + (ulong)clip._4_4_ * 8));
        local_b0 = *puVar4;
      }
      if ((this->props).attribute_divisor.maxVertexAttribDivisor < local_b0) {
        return false;
      }
      if (((i._3_1_ & 1) != 0) &&
         ((this->features).attribute_divisor.vertexAttributeInstanceRateZeroDivisor == 0)) {
        return false;
      }
      if (((i._2_1_ & 1) != 0) &&
         ((this->features).attribute_divisor.vertexAttributeInstanceRateDivisor == 0)) {
        return false;
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE) {
      resolve._6_1_ = 0;
      resolve._5_1_ = 0;
      bVar3 = false;
      if (this->api_version < 0x402000) {
        std::allocator<char>::allocator();
        resolve._6_1_ = 1;
        std::__cxx11::string::string
                  (local_150,"VK_KHR_depth_stencil_resolve",(allocator *)((long)&resolve + 7));
        resolve._5_1_ = 1;
        sVar5 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&this->enabled_extensions,(key_type *)local_150);
        bVar3 = sVar5 == 0;
      }
      if ((resolve._5_1_ & 1) != 0) {
        std::__cxx11::string::~string(local_150);
      }
      if ((resolve._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&resolve + 7));
      }
      if (bVar3) {
        return false;
      }
      _cond = base;
      if (base[1].pNext != (VkBaseInStructure *)0x0) {
        bVar3 = attachment_reference2_is_supported(this,(VkAttachmentReference2 *)base[1].pNext);
        if (!bVar3) {
          return false;
        }
        if ((_cond[1].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) &&
           (((this->props).ds_resolve.supportedDepthResolveModes & _cond[1].sType) ==
            VK_STRUCTURE_TYPE_APPLICATION_INFO)) {
          return false;
        }
        if ((*(int *)&_cond[1].field_0x4 != 0) &&
           (((this->props).ds_resolve.supportedStencilResolveModes & *(uint *)&_cond[1].field_0x4)
            == 0)) {
          return false;
        }
        if (_cond[1].sType != *(VkStructureType *)&_cond[1].field_0x4) {
          local_68b = true;
          if (_cond[1].sType != VK_STRUCTURE_TYPE_APPLICATION_INFO) {
            local_68b = *(int *)&_cond[1].field_0x4 == 0;
          }
          attachment._7_1_ = local_68b;
          if (local_68b == false) {
            local_690 = (this->props).ds_resolve.independentResolve;
          }
          else {
            local_690 = (this->props).ds_resolve.independentResolveNone;
          }
          attachment._0_4_ = local_690;
          if (local_690 == 0) {
            return false;
          }
        }
        if ((_cond[1].sType == VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO) ||
           (*(int *)&_cond[1].field_0x4 == 0x10)) {
          return false;
        }
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT) {
      if ((this->features).fragment_density.fragmentDensityMap == 0) {
        return false;
      }
    }
    else if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO) {
      if (VVar1 == VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR) {
        if ((this->features).fragment_shading_rate.attachmentFragmentShadingRate == 0) {
          return false;
        }
        _height = base;
        if (*(long *)(base + 1) != 0) {
          bVar3 = attachment_reference2_is_supported(this,*(VkAttachmentReference2 **)(base + 1));
          if (!bVar3) {
            return false;
          }
          higher = *(uint32_t *)&_height[1].pNext;
          lower = *(uint *)((long)&_height[1].pNext + 4);
          if ((higher == 0) || (lower == 0)) {
            return false;
          }
          if (higher < (this->props).fragment_shading_rate.minFragmentShadingRateAttachmentTexelSize
                       .width) {
            return false;
          }
          if ((this->props).fragment_shading_rate.maxFragmentShadingRateAttachmentTexelSize.width <
              higher) {
            return false;
          }
          if (lower < (this->props).fragment_shading_rate.minFragmentShadingRateAttachmentTexelSize.
                      height) {
            return false;
          }
          if ((this->props).fragment_shading_rate.maxFragmentShadingRateAttachmentTexelSize.height <
              lower) {
            return false;
          }
          puVar4 = std::max<unsigned_int>(&higher,&lower);
          aspect = *puVar4;
          puVar4 = std::min<unsigned_int>(&higher,&lower);
          local_180 = *puVar4;
          info._4_4_ = aspect / local_180;
          if ((this->props).fragment_shading_rate.
              maxFragmentShadingRateAttachmentTexelSizeAspectRatio < info._4_4_) {
            return false;
          }
        }
      }
      else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR) {
        if ((this->features).fragment_shading_rate.pipelineFragmentShadingRate == 0) {
          return false;
        }
      }
      else if (VVar1 + ~VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DYNAMIC_RENDERING_LOCAL_READ_FEATURES < 2)
      {
        if ((this->features).dynamic_rendering_local_read.dynamicRenderingLocalRead == 0) {
          return false;
        }
      }
      else if (VVar1 == VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT) {
        if ((this->features).separate_ds_layout.separateDepthStencilLayouts == 0) {
          return false;
        }
        local_130 = base;
        bVar3 = image_layout_is_supported(this,base[1].sType);
        if (!bVar3) {
          return false;
        }
      }
      else if (VVar1 == VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT) {
        if ((this->features).separate_ds_layout.separateDepthStencilLayouts == 0) {
          return false;
        }
        layout_1 = (VkAttachmentReferenceStencilLayout *)base;
        bVar3 = image_layout_is_supported(this,base[1].sType);
        if (!bVar3) {
          return false;
        }
        bVar3 = image_layout_is_supported(this,*(VkImageLayout *)&layout_1->field_0x14);
        if (!bVar3) {
          return false;
        }
      }
      else if (VVar1 == 
               VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_1b8,"VK_EXT_provoking_vertex",(allocator *)((long)&info_1 + 7));
        sVar5 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&this->enabled_extensions,(key_type *)local_1b8);
        std::__cxx11::string::~string(local_1b8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&info_1 + 7));
        if (sVar5 == 0) {
          return false;
        }
        local_1c8 = base;
        if ((base[1].sType == VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO) &&
           ((this->features).provoking_vertex.provokingVertexLast == 0)) {
          return false;
        }
      }
      else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO) {
        lists = (VkMutableDescriptorTypeCreateInfoEXT *)base;
        if ((base[1].sType == VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO) &&
           ((this->features).line_rasterization.rectangularLines == 0)) {
          return false;
        }
        if ((base[1].sType == VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO) &&
           ((this->features).line_rasterization.bresenhamLines == 0)) {
          return false;
        }
        if ((base[1].sType == VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO) &&
           ((this->features).line_rasterization.smoothLines == 0)) {
          return false;
        }
        if (*(int *)&base[1].field_0x4 == 1) {
          if ((base[1].sType == VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO) &&
             ((this->features).line_rasterization.stippledRectangularLines == 0)) {
            return false;
          }
          if ((base[1].sType == VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO) &&
             ((this->features).line_rasterization.stippledBresenhamLines == 0)) {
            return false;
          }
          if ((base[1].sType == VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO) &&
             ((this->features).line_rasterization.stippledSmoothLines == 0)) {
            return false;
          }
        }
      }
      else if (VVar1 == VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_638,"VK_EXT_depth_bias_control",(allocator *)((long)&info_7 + 7));
        sVar5 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&this->enabled_extensions,(key_type *)local_638);
        std::__cxx11::string::~string(local_638);
        std::allocator<char>::~allocator((allocator<char> *)((long)&info_7 + 7));
        if (sVar5 == 0) {
          return false;
        }
        local_648 = base;
        if ((base[1].sType == VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO) &&
           ((this->features).depth_bias_control.leastRepresentableValueForceUnormRepresentation == 0
           )) {
          return false;
        }
        if ((base[1].sType == VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO) &&
           ((this->features).depth_bias_control.floatRepresentation == 0)) {
          return false;
        }
      }
      else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_1e8,"VK_EXT_custom_border_color",(allocator *)((long)&info_2 + 7));
        sVar5 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&this->enabled_extensions,(key_type *)local_1e8);
        std::__cxx11::string::~string(local_1e8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&info_2 + 7));
        if (sVar5 == 0) {
          return false;
        }
        local_1f8 = base;
        if ((base[2].sType == VK_STRUCTURE_TYPE_APPLICATION_INFO) &&
           ((this->features).custom_border_color.customBorderColorWithoutFormat == 0)) {
          return false;
        }
      }
      else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR) {
LAB_0011c8de:
        if ((this->features).graphics_pipeline_library.graphicsPipelineLibrary == 0) {
          return false;
        }
      }
      else if (VVar1 == VK_STRUCTURE_TYPE_MEMORY_BARRIER_2) {
        if ((this->features).synchronization2.synchronization2 == 0) {
          return false;
        }
      }
      else {
        if (VVar1 == VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT) goto LAB_0011c8de;
        if (VVar1 == VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT) {
          if ((this->features).mutable_descriptor_type.mutableDescriptorType == 0) {
            return false;
          }
          _j = base;
          for (layout._4_4_ = VK_STRUCTURE_TYPE_APPLICATION_INFO; layout._4_4_ < base[1].sType;
              layout._4_4_ = layout._4_4_ + VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO) {
            for (layout._0_4_ = VK_STRUCTURE_TYPE_APPLICATION_INFO;
                (VkStructureType)layout < base[1].pNext[layout._4_4_].sType;
                layout._0_4_ = (VkStructureType)layout + VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO) {
              VVar1 = (&(base[1].pNext[layout._4_4_].pNext)->sType)[(VkStructureType)layout];
              if ((VVar1 != VK_STRUCTURE_TYPE_APPLICATION_INFO) &&
                 (5 < VVar1 - VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO)) {
                return false;
              }
            }
          }
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT) {
          if ((this->features).depth_clip_control.depthClipControl == 0) {
            return false;
          }
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT) {
          if ((this->features).multisampled_render_to_single_sampled.
              multisampledRenderToSingleSampled == 0) {
            return false;
          }
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT) {
          if ((this->features).color_write_enable.colorWriteEnable == 0) {
            return false;
          }
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT)
        {
          if ((this->features).border_color_swizzle.borderColorSwizzle == 0) {
            return false;
          }
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT) {
          if ((this->features).subpass_merge_feedback.subpassMergeFeedback == 0) {
            return false;
          }
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO) {
          if ((this->features).maintenance5.maintenance5 == 0) {
            return false;
          }
        }
        else {
          if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT) {
            fprintf(_stderr,
                    "Fossilize ERROR: Unrecognized pNext sType: %u. Treating as unsupported.\n",
                    (ulong)base->sType);
            fflush(_stderr);
            return false;
          }
          if ((this->features).depth_clamp_control.depthClampControl == 0) {
            return false;
          }
        }
      }
    }
    base = local_28->pNext;
  } while( true );
}

Assistant:

bool FeatureFilter::Impl::pnext_chain_is_supported(const void *pNext) const
{
	while (pNext)
	{
		auto *base = static_cast<const VkBaseInStructure *>(pNext);

		// These are the currently pNext structs which Fossilize serialize.

		switch (base->sType)
		{
		case VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO:
			if (!enabled_extensions.count(VK_KHR_MAINTENANCE2_EXTENSION_NAME) && api_version < VK_API_VERSION_1_1)
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_KHR:
		{
			if (!enabled_extensions.count(VK_EXT_VERTEX_ATTRIBUTE_DIVISOR_EXTENSION_NAME) &&
			    !enabled_extensions.count(VK_KHR_VERTEX_ATTRIBUTE_DIVISOR_EXTENSION_NAME))
				return false;

			auto *divisor = static_cast<const VkPipelineVertexInputDivisorStateCreateInfoEXT *>(pNext);
			bool use_zero_divisor = false;
			bool use_non_identity_divisor = false;
			uint32_t max_divisor = 0;

			for (uint32_t i = 0; i < divisor->vertexBindingDivisorCount; i++)
			{
				if (divisor->pVertexBindingDivisors[i].divisor != 1)
					use_non_identity_divisor = true;
				if (divisor->pVertexBindingDivisors[i].divisor == 0)
					use_zero_divisor = true;
				max_divisor = (std::max)(max_divisor, divisor->pVertexBindingDivisors[i].divisor);
			}

			if (max_divisor > props.attribute_divisor.maxVertexAttribDivisor)
				return false;
			if (use_zero_divisor && !features.attribute_divisor.vertexAttributeInstanceRateZeroDivisor)
				return false;
			if (use_non_identity_divisor && !features.attribute_divisor.vertexAttributeInstanceRateDivisor)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT:
		{
			auto *clip = static_cast<const VkPipelineRasterizationDepthClipStateCreateInfoEXT *>(pNext);
			if (clip->depthClipEnable && !features.depth_clip.depthClipEnable)
				return false;
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT:
			if (features.transform_feedback.geometryStreams == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO:
		{
			if (features.multiview.multiview == VK_FALSE)
				return false;

			auto *multiview = static_cast<const VkRenderPassMultiviewCreateInfo *>(pNext);

			for (uint32_t i = 0; i < multiview->subpassCount; i++)
			{
				if (!multiview_mask_is_supported(multiview->pViewMasks[i]))
					return false;
			}

			for (uint32_t i = 0; i < multiview->correlationMaskCount; i++)
			{
				if (!multiview_mask_is_supported(multiview->pCorrelationMasks[i]))
					return false;
			}

			break;
		}

		case VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO_EXT:
		{
			auto *flags = static_cast<const VkDescriptorSetLayoutBindingFlagsCreateInfo *>(pNext);
			VkDescriptorBindingFlagsEXT flag_union = 0;
			for (uint32_t i = 0; i < flags->bindingCount; i++)
				flag_union |= flags->pBindingFlags[i];

			if ((flag_union & VK_DESCRIPTOR_BINDING_UPDATE_UNUSED_WHILE_PENDING_BIT) != 0 &&
			    features.descriptor_indexing.descriptorBindingUpdateUnusedWhilePending == VK_FALSE)
			{
				return false;
			}

			if ((flag_union & VK_DESCRIPTOR_BINDING_PARTIALLY_BOUND_BIT) != 0 &&
			    features.descriptor_indexing.descriptorBindingPartiallyBound == VK_FALSE)
			{
				return false;
			}

			if ((flag_union & VK_DESCRIPTOR_BINDING_VARIABLE_DESCRIPTOR_COUNT_BIT) != 0 &&
			    features.descriptor_indexing.descriptorBindingVariableDescriptorCount == VK_FALSE)
			{
				return false;
			}

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT:
			if (features.blend_operation_advanced.advancedBlendCoherentOperations == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT:
			if (!enabled_extensions.count(VK_EXT_CONSERVATIVE_RASTERIZATION_EXTENSION_NAME))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO_KHR:
		{
			auto *line = static_cast<const VkPipelineRasterizationLineStateCreateInfoKHR *>(pNext);
			if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_RECTANGULAR_KHR &&
			    features.line_rasterization.rectangularLines == VK_FALSE)
			{
				return false;
			}

			if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_BRESENHAM_KHR &&
			    features.line_rasterization.bresenhamLines == VK_FALSE)
			{
				return false;
			}

			if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_RECTANGULAR_SMOOTH_KHR &&
			    features.line_rasterization.smoothLines == VK_FALSE)
			{
				return false;
			}

			if (line->stippledLineEnable == VK_TRUE)
			{
				if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_RECTANGULAR_KHR &&
				    features.line_rasterization.stippledRectangularLines == VK_FALSE)
				{
					return false;
				}

				if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_BRESENHAM_KHR &&
				    features.line_rasterization.stippledBresenhamLines == VK_FALSE)
				{
					return false;
				}

				if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_RECTANGULAR_SMOOTH_KHR &&
				    features.line_rasterization.stippledSmoothLines == VK_FALSE)
				{
					return false;
				}
			}

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT:
			// The details are validated explicitly elsewhere since we need to know the shader create info to deduce correctness.
			break;

		case VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT:
		{
			if (features.mutable_descriptor_type.mutableDescriptorType == VK_FALSE)
				return false;

			auto *lists = static_cast<const VkMutableDescriptorTypeCreateInfoEXT *>(pNext);
			for (uint32_t i = 0; i < lists->mutableDescriptorTypeListCount; i++)
			{
				for (uint32_t j = 0; j < lists->pMutableDescriptorTypeLists[i].descriptorTypeCount; j++)
				{
					switch (lists->pMutableDescriptorTypeLists[i].pDescriptorTypes[j])
					{
					case VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER:
					case VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER:
					case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER:
					case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER:
					case VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
					case VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
					case VK_DESCRIPTOR_TYPE_SAMPLER:
						break;

					default:
						// Implementation can theoretically support beyond this (and we'd have to query support),
						// but validate against what is required.
						return false;
					}
				}
			}

			break;
		}

		case VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT:
		{
			if (!features.separate_ds_layout.separateDepthStencilLayouts)
				return false;

			auto *layout = static_cast<const VkAttachmentDescriptionStencilLayout *>(pNext);
			if (!image_layout_is_supported(layout->stencilInitialLayout))
				return false;
			if (!image_layout_is_supported(layout->stencilFinalLayout))
				return false;
			break;
		}

		case VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT:
		{
			if (!features.separate_ds_layout.separateDepthStencilLayouts)
				return false;

			auto *layout = static_cast<const VkAttachmentReferenceStencilLayout *>(pNext);
			if (!image_layout_is_supported(layout->stencilLayout))
				return false;
			break;
		}

		case VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE:
		{
			if (api_version < VK_API_VERSION_1_2 && !enabled_extensions.count(VK_KHR_DEPTH_STENCIL_RESOLVE_EXTENSION_NAME))
				return false;

			auto *resolve = static_cast<const VkSubpassDescriptionDepthStencilResolve *>(pNext);

			if (!resolve->pDepthStencilResolveAttachment)
				break;

			if (!attachment_reference2_is_supported(*resolve->pDepthStencilResolveAttachment))
				return false;

			if (resolve->depthResolveMode &&
			    (props.ds_resolve.supportedDepthResolveModes & resolve->depthResolveMode) == 0)
				return false;

			if (resolve->stencilResolveMode &&
			    (props.ds_resolve.supportedStencilResolveModes & resolve->stencilResolveMode) == 0)
				return false;

			if (resolve->depthResolveMode != resolve->stencilResolveMode)
			{
				bool use_zero = resolve->depthResolveMode == VK_RESOLVE_MODE_NONE ||
				                resolve->stencilResolveMode == VK_RESOLVE_MODE_NONE;

				auto cond = use_zero ?
				            props.ds_resolve.independentResolveNone :
				            props.ds_resolve.independentResolve;
				if (!cond)
					return false;
			}

			if (resolve->depthResolveMode == VK_RESOLVE_MODE_EXTERNAL_FORMAT_DOWNSAMPLE_ANDROID ||
			    resolve->stencilResolveMode == VK_RESOLVE_MODE_EXTERNAL_FORMAT_DOWNSAMPLE_ANDROID)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR:
		{
			if (!features.fragment_shading_rate.attachmentFragmentShadingRate)
				return false;

			auto *attachment = static_cast<const VkFragmentShadingRateAttachmentInfoKHR *>(pNext);

			if (!attachment->pFragmentShadingRateAttachment)
				break;

			if (!attachment_reference2_is_supported(*attachment->pFragmentShadingRateAttachment))
				return false;

			uint32_t width = attachment->shadingRateAttachmentTexelSize.width;
			uint32_t height = attachment->shadingRateAttachmentTexelSize.height;

			if (width == 0 || height == 0)
				return false;

			if (width < props.fragment_shading_rate.minFragmentShadingRateAttachmentTexelSize.width)
				return false;
			if (width > props.fragment_shading_rate.maxFragmentShadingRateAttachmentTexelSize.width)
				return false;
			if (height < props.fragment_shading_rate.minFragmentShadingRateAttachmentTexelSize.height)
				return false;
			if (height > props.fragment_shading_rate.maxFragmentShadingRateAttachmentTexelSize.height)
				return false;

			uint32_t higher = (std::max)(width, height);
			uint32_t lower = (std::min)(width, height);
			uint32_t aspect = higher / lower;
			if (aspect > props.fragment_shading_rate.maxFragmentShadingRateAttachmentTexelSizeAspectRatio)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR:
		{
			if (features.dynamic_rendering.dynamicRendering == VK_FALSE)
				return false;

			auto *info = static_cast<const VkPipelineRenderingCreateInfoKHR *>(pNext);

			for (uint32_t i = 0; i < info->colorAttachmentCount; i++)
			{
				if (info->pColorAttachmentFormats[i] != VK_FORMAT_UNDEFINED &&
				    !format_is_supported(info->pColorAttachmentFormats[i], VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT))
				{
					return false;
				}
			}

			if (info->depthAttachmentFormat != VK_FORMAT_UNDEFINED &&
			    !format_is_supported(info->depthAttachmentFormat, VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT))
			{
				return false;
			}

			if (info->stencilAttachmentFormat != VK_FORMAT_UNDEFINED &&
			    !format_is_supported(info->stencilAttachmentFormat, VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT))
			{
				return false;
			}

			if (info->depthAttachmentFormat != VK_FORMAT_UNDEFINED &&
			    info->stencilAttachmentFormat != VK_FORMAT_UNDEFINED &&
			    info->depthAttachmentFormat != info->stencilAttachmentFormat)
			{
				return false;
			}

			if (info->viewMask && !multiview_mask_is_supported(info->viewMask))
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT:
		{
			if (!features.color_write_enable.colorWriteEnable)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT:
		{
			if (!enabled_extensions.count(VK_EXT_PROVOKING_VERTEX_EXTENSION_NAME))
				return false;

			auto *info = static_cast<const VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *>(pNext);

			if (info->provokingVertexMode == VK_PROVOKING_VERTEX_MODE_LAST_VERTEX_EXT &&
			    !features.provoking_vertex.provokingVertexLast)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT:
		{
			if (!enabled_extensions.count(VK_EXT_CUSTOM_BORDER_COLOR_EXTENSION_NAME))
				return false;

			auto *info = static_cast<const VkSamplerCustomBorderColorCreateInfoEXT *>(pNext);

			if (info->format == VK_FORMAT_UNDEFINED &&
			    !features.custom_border_color.customBorderColorWithoutFormat)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO:
		{
			if (!enabled_extensions.count(VK_EXT_SAMPLER_FILTER_MINMAX_EXTENSION_NAME) && !features.vk12.samplerFilterMinmax)
				return false;

			auto *info = static_cast<const VkSamplerReductionModeCreateInfo *>(pNext);
			switch (info->reductionMode)
			{
			case VK_SAMPLER_REDUCTION_MODE_MAX:
			case VK_SAMPLER_REDUCTION_MODE_MIN:
			case VK_SAMPLER_REDUCTION_MODE_WEIGHTED_AVERAGE:
				break;

			default:
				return false;
			}

			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO:
		{
			if (!enabled_extensions.count(VK_KHR_MAINTENANCE_2_EXTENSION_NAME) && api_version < VK_API_VERSION_1_1)
				return false;

			auto *info = static_cast<const VkRenderPassInputAttachmentAspectCreateInfo *>(pNext);
			for (uint32_t i = 0; i < info->aspectReferenceCount; i++)
				if (!aspect_mask_is_supported(info->pAspectReferences[i].aspectMask))
					return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT:
		{
			if (!enabled_extensions.count(VK_EXT_DISCARD_RECTANGLES_EXTENSION_NAME))
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_MEMORY_BARRIER_2_KHR:
		{
			if (!features.synchronization2.synchronization2)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR:
		{
			if (!features.fragment_shading_rate.pipelineFragmentShadingRate)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_INFO:
		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO:
		{
			// Should also validate formats and all sorts of feature bits, but
			// consider that TODO for now.
			// YcbcrConversionCreateInfo is inlined into a VkSamplerCreateInfo when replaying from a Fossilize archive.
			// Normally, it's not a pNext, but we pretend it is to make capture and replay
			// a bit more sane.
			if (!features.ycbcr_conversion.samplerYcbcrConversion)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR:
		case VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT:
		{
			if (features.graphics_pipeline_library.graphicsPipelineLibrary == VK_FALSE)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT:
		{
			if (!enabled_extensions.count(VK_EXT_SAMPLE_LOCATIONS_EXTENSION_NAME))
				return false;

			auto *info = static_cast<const VkPipelineSampleLocationsStateCreateInfoEXT *>(pNext);
			// If count is 0, this is part of dynamic state, so just ignore it.
			if (!info->sampleLocationsEnable || info->sampleLocationsInfo.sampleLocationsCount == 0)
				break;

			if (info->sampleLocationsInfo.sampleLocationGridSize.width > props.sample_locations.maxSampleLocationGridSize.width ||
			    info->sampleLocationsInfo.sampleLocationGridSize.height > props.sample_locations.maxSampleLocationGridSize.height)
			{
				return false;
			}

			if ((props.sample_locations.sampleLocationSampleCounts & info->sampleLocationsInfo.sampleLocationsPerPixel) == 0)
				return false;

			// Sample positions are clamped by implementation.
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT:
		{
			if (!features.depth_clip_control.depthClipControl)
			{
				return false;
			}

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO_EXT:
		{
			if (enabled_extensions.count(VK_EXT_PIPELINE_ROBUSTNESS_EXTENSION_NAME) == 0)
				return false;
			auto *info = static_cast<const VkPipelineRobustnessCreateInfoEXT *>(pNext);

			if ((info->storageBuffers != VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_DEVICE_DEFAULT_EXT ||
			     info->images != VK_PIPELINE_ROBUSTNESS_IMAGE_BEHAVIOR_DEVICE_DEFAULT_EXT ||
			     info->uniformBuffers != VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_DEVICE_DEFAULT_EXT ||
			     info->vertexInputs != VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_DEVICE_DEFAULT_EXT) &&
			    features.pipeline_robustness.pipelineRobustness == VK_FALSE)
			{
				return false;
			}

			if (!query)
				return false;

			bool need_robust_image =
					info->images == VK_PIPELINE_ROBUSTNESS_IMAGE_BEHAVIOR_ROBUST_IMAGE_ACCESS_EXT;
			bool need_robust_image2 =
					info->images == VK_PIPELINE_ROBUSTNESS_IMAGE_BEHAVIOR_ROBUST_IMAGE_ACCESS_2_EXT;
			bool need_robust_buffer2 =
					info->storageBuffers == VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_ROBUST_BUFFER_ACCESS_2_EXT ||
					info->vertexInputs == VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_ROBUST_BUFFER_ACCESS_2_EXT ||
					info->uniformBuffers == VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_ROBUST_BUFFER_ACCESS_2_EXT;

			// From spec:
			// Any component of the implementation (the loader, any enabled layers, and drivers) must skip over,
			// without processing (other than reading the sType and pNext members)
			// any extending structures in the chain not defined by core versions
			// or extensions supported by that component.
			// I.e. it's safe for us to query the struct, even if the extension is not supported.

			if (need_robust_image)
			{
				VkPhysicalDeviceFeatures2 pdf2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
				VkPhysicalDeviceImageRobustnessFeaturesEXT robust_image =
						{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES_EXT };
				pdf2.pNext = &robust_image;
				query->physical_device_feature_query(&pdf2);
				if (robust_image.robustImageAccess == VK_FALSE)
					return false;
			}

			if (need_robust_image2)
			{
				VkPhysicalDeviceFeatures2 pdf2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
				VkPhysicalDeviceRobustness2FeaturesEXT robust2 =
						{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT };
				pdf2.pNext = &robust2;
				query->physical_device_feature_query(&pdf2);
				if (robust2.robustImageAccess2 == VK_FALSE)
					return false;
			}

			if (need_robust_buffer2)
			{
				VkPhysicalDeviceFeatures2 pdf2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
				VkPhysicalDeviceRobustness2FeaturesEXT robust2 =
						{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT };
				pdf2.pNext = &robust2;
				query->physical_device_feature_query(&pdf2);
				if (robust2.robustBufferAccess2 == VK_FALSE)
					return false;
			}

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR:
			// Actual flags are validated separately.
			if (features.maintenance5.maintenance5 == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT:
			if (features.subpass_merge_feedback.subpassMergeFeedback == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT:
			if (features.border_color_swizzle.borderColorSwizzle == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT:
			if (features.multisampled_render_to_single_sampled.multisampledRenderToSingleSampled == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT:
		{
			if (enabled_extensions.count(VK_EXT_DEPTH_BIAS_CONTROL_EXTENSION_NAME) == 0)
				return false;

			auto *info = static_cast<const VkDepthBiasRepresentationInfoEXT *>(pNext);
			if (info->depthBiasRepresentation == VK_DEPTH_BIAS_REPRESENTATION_LEAST_REPRESENTABLE_VALUE_FORCE_UNORM_EXT &&
			    features.depth_bias_control.leastRepresentableValueForceUnormRepresentation == VK_FALSE)
				return false;

			if (info->depthBiasRepresentation == VK_DEPTH_BIAS_REPRESENTATION_FLOAT_EXT &&
			    features.depth_bias_control.floatRepresentation == VK_FALSE)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT:
			if (features.fragment_density.fragmentDensityMap == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT:
			if (enabled_extensions.count(VK_EXT_SAMPLE_LOCATIONS_EXTENSION_NAME) == 0)
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT:
			if (features.depth_clamp_control.depthClampControl == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO_KHR:
		case VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO_KHR:
		{
			if (features.dynamic_rendering_local_read.dynamicRenderingLocalRead == VK_FALSE)
				return false;
			break;
		}

		default:
			LOGE("Unrecognized pNext sType: %u. Treating as unsupported.\n", unsigned(base->sType));
			return false;
		}

		pNext = base->pNext;
	}
	return true;
}